

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginMenuEx(char *label,char *icon,bool enabled)

{
  ImVec2 pos_00;
  ImVec2 pos_01;
  bool bVar1;
  ImGuiPopupData *pIVar2;
  byte in_DL;
  ImVec2 in_RSI;
  uint uVar3;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  float fVar7;
  float extra;
  ImVec2 tc;
  ImVec2 tb;
  ImVec2 ta;
  ImRect next_window_rect;
  float ref_unit;
  ImGuiWindow *child_menu_window;
  bool moving_toward_other_child_menu;
  bool want_close;
  bool want_open;
  bool hovered;
  ImVec2 text_pos_1;
  float extra_w;
  float min_w;
  float checkmark_w;
  float icon_w;
  ImVec2 text_pos;
  float w;
  ImGuiSelectableFlags selectable_flags;
  bool pressed;
  ImGuiMenuColumns *offsets;
  ImVec2 pos;
  ImVec2 popup_pos;
  ImGuiWindow *backed_nav_window;
  bool menuset_is_open;
  ImVec2 label_size;
  ImGuiWindowFlags flags;
  bool menu_is_open;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  undefined4 in_stack_fffffffffffffe48;
  float in_stack_fffffffffffffe4c;
  ImGuiWindow *in_stack_fffffffffffffe50;
  float in_stack_fffffffffffffe58;
  float in_stack_fffffffffffffe5c;
  uint popup_flags;
  ImGuiWindow *in_stack_fffffffffffffe60;
  int count;
  char *in_stack_fffffffffffffe68;
  ImGuiWindow *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  uint in_stack_fffffffffffffe7c;
  ImGuiID id_00;
  undefined8 in_stack_fffffffffffffe80;
  ImVec2 *pIVar8;
  float local_178;
  undefined4 in_stack_fffffffffffffe8c;
  undefined1 uVar9;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  float fVar10;
  char *in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea4;
  ImVec2 local_150;
  float local_148;
  ImVec2 local_144;
  ImVec2 local_13c;
  ImVec2 local_134;
  ImRect local_12c;
  float local_11c;
  ImGuiWindow *local_118;
  byte local_10c;
  byte local_10b;
  byte local_10a;
  byte local_109;
  undefined1 local_108 [16];
  undefined1 local_f8 [24];
  ImVec2 local_e0;
  ImVec2 in_stack_ffffffffffffff28;
  ImVec2 in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  float local_bc;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  ImDrawList *in_stack_ffffffffffffff58;
  ImVec2 in_stack_ffffffffffffff60;
  ImVec2 local_94;
  float local_8c;
  ImVec2 local_88;
  ImVec2 local_80;
  float local_78;
  bool local_71;
  ImGuiMenuColumns *local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImGuiWindow *local_58;
  bool local_4d;
  ImVec2 local_4c;
  float local_44;
  byte local_3d;
  float local_3c;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  byte local_19;
  ImVec2 local_18;
  bool local_1;
  
  uVar9 = (undefined1)((uint)in_stack_fffffffffffffe8c >> 0x18);
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  local_28 = (ImVec2)GetCurrentWindow();
  if ((*(bool *)((long)local_28 + 0x93) & 1U) == 0) {
    local_30 = (ImVec2)GImGui;
    local_38 = (ImVec2)&GImGui->Style;
    local_3c = (float)ImGuiWindow::GetID(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                                         (char *)in_stack_fffffffffffffe60);
    local_3d = IsPopupOpen((ImGuiID)in_stack_fffffffffffffe60,
                           (ImGuiPopupFlags)in_stack_fffffffffffffe5c);
    local_44 = 2.682225e-29;
    if ((*(ImGuiWindowFlags *)((long)local_28 + 0xc) & 0x10000000U) != 0) {
      local_44 = 1.07289e-28;
    }
    bVar1 = ImVector<unsigned_int>::contains
                      ((ImVector<unsigned_int> *)((long)local_30 + 0x5348),(uint *)&local_3c);
    if (bVar1) {
      if ((local_3d & 1) == 0) {
        ImGuiNextWindowData::ClearFlags((ImGuiNextWindowData *)((long)local_30 + 0x3fb0));
      }
      else {
        local_3d = BeginPopupEx((ImGuiID)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
      }
      local_1 = (bool)(local_3d & 1);
    }
    else {
      ImVector<unsigned_int>::push_back
                ((ImVector<unsigned_int> *)in_stack_fffffffffffffe50,
                 (uint *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      local_4c = CalcTextSize((char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                              (char *)in_stack_fffffffffffffe70,
                              SUB81((ulong)in_stack_fffffffffffffe68 >> 0x38,0),
                              SUB84(in_stack_fffffffffffffe68,0));
      local_4d = IsRootOfOpenMenuSet();
      local_58 = *(ImGuiWindow **)((long)local_30 + 0x40b8);
      if (local_4d) {
        *(ImVec2 *)((long)local_30 + 0x40b8) = local_28;
      }
      ImVec2::ImVec2(&local_60);
      local_68 = ((ImGuiWindowTempData *)((long)local_28 + 0xd8))->CursorPos;
      PushID((char *)in_stack_fffffffffffffe60);
      if ((local_19 & 1) == 0) {
        BeginDisabled(SUB81((ulong)in_stack_fffffffffffffe50 >> 0x38,0));
      }
      local_70 = (ImGuiMenuColumns *)((long)local_28 + 0x144);
      local_78 = 7.346841e-39;
      if (*(ImGuiLayoutType *)((long)local_28 + 0x18c) == 0) {
        fVar10 = 0.5;
        fVar7 = (local_68.x + -1.0) - (float)(int)(((ImVec2 *)((long)local_38 + 0x4c))->x * 0.5);
        fVar4 = local_68.y - *(float *)((long)local_38 + 0x40);
        fVar5 = ImGuiWindow::MenuBarHeight(in_stack_fffffffffffffe60);
        ImVec2::ImVec2(&local_80,fVar7,fVar4 + fVar5);
        uVar9 = (undefined1)((uint)fVar4 >> 0x18);
        local_60 = local_80;
        (((ImGuiWindowTempData *)((long)local_28 + 0xd8))->CursorPos).x =
             (((ImGuiWindowTempData *)((long)local_28 + 0xd8))->CursorPos).x +
             (float)(int)(((ImVec2 *)((long)local_38 + 0x4c))->x * fVar10);
        fVar4 = ((ImVec2 *)((long)local_38 + 0x4c))->x;
        pIVar8 = &local_88;
        ImVec2::ImVec2(pIVar8,fVar4 + fVar4,*(float *)((long)local_38 + 0x50));
        PushStyleVar((ImGuiStyleVar)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        id_00 = (ImGuiID)in_stack_fffffffffffffe80;
        local_8c = local_4c.x;
        ImVec2::ImVec2(&local_94,
                       (((ImGuiWindowTempData *)((long)local_28 + 0xd8))->CursorPos).x +
                       (float)local_70->OffsetLabel,
                       *(float *)((long)local_28 + 0xdc) + *(float *)((long)local_28 + 0x110));
        fVar4 = (float)(uint)local_3d;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff64,local_8c,0.0);
        local_71 = Selectable((char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                              in_stack_ffffffffffffff30.y._3_1_,
                              (ImGuiSelectableFlags)in_stack_ffffffffffffff30.x,
                              (ImVec2 *)in_stack_ffffffffffffff28);
        pos_00.y = fVar4;
        pos_00.x = in_stack_fffffffffffffea0;
        RenderText(pos_00,(char *)pIVar8,(char *)CONCAT44(fVar10,fVar7),(bool)uVar9);
        PopStyleVar((int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
        (((ImGuiWindowTempData *)((long)local_28 + 0xd8))->CursorPos).x =
             (float)(int)(((ImVec2 *)((long)local_38 + 0x4c))->x * -0.5) +
             (((ImGuiWindowTempData *)((long)local_28 + 0xd8))->CursorPos).x;
      }
      else {
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff50,local_68.x,
                       local_68.y - *(float *)((long)local_38 + 0xc));
        local_60.y = in_stack_ffffffffffffff54;
        local_60.x = in_stack_ffffffffffffff50;
        if ((local_18 == (ImVec2)0x0) || (*(char *)local_18 == '\0')) {
          local_178 = 0.0;
        }
        else {
          IVar6 = CalcTextSize((char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                               ,(char *)in_stack_fffffffffffffe70,
                               SUB81((ulong)in_stack_fffffffffffffe68 >> 0x38,0),
                               SUB84(in_stack_fffffffffffffe68,0));
          local_bc = IVar6.x;
          local_178 = local_bc;
        }
        fVar7 = 0.0;
        fVar4 = ImGuiMenuColumns::DeclColumns
                          ((ImGuiMenuColumns *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                           in_stack_fffffffffffffe58,
                           (float)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                           SUB84(in_stack_fffffffffffffe50,0));
        IVar6 = GetContentRegionAvail();
        fVar5 = ImMax<float>(fVar7,IVar6.x - fVar4);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff28,
                       (((ImGuiWindowTempData *)((long)local_28 + 0xd8))->CursorPos).x +
                       (float)local_70->OffsetLabel,
                       *(float *)((long)local_28 + 0xdc) + *(float *)((long)local_28 + 0x110));
        in_stack_fffffffffffffe7c = (uint)local_3d;
        pIVar8 = &local_e0;
        ImVec2::ImVec2(pIVar8,fVar4,fVar7);
        id_00 = (ImGuiID)pIVar8;
        local_71 = Selectable((char *)CONCAT44(fVar4,fVar5),IVar6.y._3_1_,
                              (ImGuiSelectableFlags)IVar6.x,(ImVec2 *)in_stack_ffffffffffffff28);
        IVar6.y = in_stack_fffffffffffffea4;
        IVar6.x = in_stack_fffffffffffffea0;
        RenderText(IVar6,in_stack_fffffffffffffe98,
                   (char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),(bool)uVar9
                  );
        if (0.0 < local_178) {
          in_stack_fffffffffffffe70 = (ImGuiWindow *)local_f8;
          ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffe70,(float)local_70->OffsetIcon,0.0);
          local_f8._8_8_ =
               operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                         (ImVec2 *)0x193c53);
          pos_01.y = in_stack_fffffffffffffea4;
          pos_01.x = in_stack_fffffffffffffea0;
          RenderText(pos_01,in_stack_fffffffffffffe98,
                     (char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     (bool)uVar9);
        }
        in_stack_fffffffffffffe60 = (ImGuiWindow *)local_108;
        ImVec2::ImVec2((ImVec2 *)in_stack_fffffffffffffe60,
                       *(float *)((long)local_30 + 0x3c18) * 0.3 +
                       (float)local_70->OffsetMark + fVar5,0.0);
        local_108._8_8_ =
             operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                       (ImVec2 *)0x193cf3);
        GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                    SUB84(in_stack_fffffffffffffe60,0));
        RenderArrow(in_stack_ffffffffffffff58,in_stack_ffffffffffffff60,
                    (ImU32)in_stack_ffffffffffffff54,(ImGuiDir)in_stack_ffffffffffffff50,local_178);
      }
      if ((local_19 & 1) == 0) {
        EndDisabled();
      }
      popup_flags = (uint)in_stack_fffffffffffffe5c & 0xffffff;
      if ((*(float *)((long)local_30 + 0x3ee0) == local_3c) &&
         (popup_flags = (uint)in_stack_fffffffffffffe5c & 0xffffff, (local_19 & 1) != 0)) {
        popup_flags = CONCAT13(*(bool *)((long)local_30 + 0x40fb),SUB43(in_stack_fffffffffffffe5c,0)
                              ) ^ 0xff000000;
      }
      local_109 = (byte)(popup_flags >> 0x18) & 1;
      if ((local_4d & 1U) != 0) {
        *(ImGuiWindow **)((long)local_30 + 0x40b8) = local_58;
      }
      local_10a = 0;
      local_10b = 0;
      if (*(ImGuiLayoutType *)((long)local_28 + 0x18c) == 1) {
        local_10c = 0;
        if ((((ImVector<ImGuiPopupData> *)((long)local_30 + 0x4090))->Size <
             ((ImVector<ImGuiPopupData> *)((long)local_30 + 0x4080))->Size) &&
           (pIVar2 = ImVector<ImGuiPopupData>::operator[]
                               ((ImVector<ImGuiPopupData> *)((long)local_30 + 0x4080),
                                ((ImVector<ImGuiPopupData> *)((long)local_30 + 0x4090))->Size),
           (ImVec2)pIVar2->SourceWindow == local_28)) {
          pIVar2 = ImVector<ImGuiPopupData>::operator[]
                             ((ImVector<ImGuiPopupData> *)((long)local_30 + 0x4080),
                              ((ImVector<ImGuiPopupData> *)((long)local_30 + 0x4090))->Size);
          in_stack_fffffffffffffe50 = pIVar2->Window;
        }
        else {
          in_stack_fffffffffffffe50 = (ImGuiWindow *)0x0;
        }
        local_118 = in_stack_fffffffffffffe50;
        if (((*(ImVec2 *)((long)local_30 + 0x3eb0) == local_28) &&
            (in_stack_fffffffffffffe50 != (ImGuiWindow *)0x0)) &&
           ((*(ImGuiWindowFlags *)((long)local_28 + 0xc) & 0x400U) == 0)) {
          local_11c = *(float *)((long)local_30 + 0x3c18);
          local_12c = ImGuiWindow::Rect((ImGuiWindow *)0x193ed4);
          local_134 = operator-((ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                                (ImVec2 *)0x193f04);
          if ((local_118->Pos).x <= ((ImVec2 *)((long)local_28 + 0x10))->x) {
            local_13c = ImRect::GetTR((ImRect *)
                                      CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
            ;
          }
          else {
            local_13c = ImRect::GetTL(&local_12c);
          }
          if ((local_118->Pos).x <= ((ImVec2 *)((long)local_28 + 0x10))->x) {
            local_144 = ImRect::GetBR(&local_12c);
          }
          else {
            local_144 = ImRect::GetBL((ImRect *)
                                      CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
            ;
          }
          local_148 = ImClamp<float>(ABS(local_134.x - local_13c.x) * 0.3,local_11c * 0.5,
                                     local_11c * 2.5);
          uVar3 = -(uint)(((ImVec2 *)((long)local_28 + 0x10))->x < (local_118->Pos).x);
          local_134.x = (float)(~uVar3 & 0x3f000000 | uVar3 & 0xbf000000) + local_134.x;
          fVar4 = local_134.y;
          fVar5 = ImMax<float>((local_13c.y - local_148) - local_134.y,-local_11c * 8.0);
          local_13c.y = fVar4 + fVar5;
          in_stack_fffffffffffffe4c = local_134.y;
          fVar4 = ImMin<float>((local_144.y + local_148) - local_134.y,local_11c * 8.0);
          local_144.y = in_stack_fffffffffffffe4c + fVar4;
          local_10c = ImTriangleContainsPoint
                                (&local_134,&local_13c,&local_144,(ImVec2 *)((long)local_30 + 0xd94)
                                );
        }
        if (((((local_3d & 1) != 0) && ((local_109 & 1) == 0)) &&
            ((*(ImVec2 *)((long)local_30 + 0x3eb0) == local_28 &&
             ((*(ImGuiID *)((long)local_30 + 0x3ee4) != 0 &&
              (*(float *)((long)local_30 + 0x3ee4) != local_3c)))))) && ((local_10c & 1) == 0)) {
          local_10b = 1;
        }
        if (((local_3d & 1) == 0) && ((local_71 & 1U) != 0)) {
          local_10a = 1;
        }
        else if (((local_3d & 1) == 0) && (((local_109 & 1) != 0 && ((local_10c & 1) == 0)))) {
          local_10a = 1;
        }
        if ((*(float *)((long)local_30 + 0x40c0) == local_3c) &&
           (*(ImGuiDir *)((long)local_30 + 0x4124) == 1)) {
          local_10a = 1;
          NavMoveRequestCancel();
        }
      }
      else if ((((local_3d & 1) == 0) || ((local_71 & 1U) == 0)) || ((local_4d & 1U) == 0)) {
        if (((local_71 & 1U) == 0) &&
           ((((popup_flags & 0x1000000) == 0 || ((local_4d & 1U) == 0)) || ((local_3d & 1) != 0))))
        {
          if ((*(float *)((long)local_30 + 0x40c0) == local_3c) &&
             (*(ImGuiDir *)((long)local_30 + 0x4124) == 3)) {
            local_10a = 1;
            NavMoveRequestCancel();
          }
        }
        else {
          local_10a = 1;
        }
      }
      else {
        local_10b = 1;
        local_3d = 0;
        local_10a = 0;
      }
      if ((local_19 & 1) == 0) {
        local_10b = 1;
      }
      if (((local_10b & 1) != 0) &&
         (bVar1 = IsPopupOpen((ImGuiID)in_stack_fffffffffffffe60,popup_flags), bVar1)) {
        ClosePopupToLevel((int)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                          SUB81((ulong)in_stack_fffffffffffffe60 >> 0x18,0));
      }
      count = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
      PopID();
      if ((((local_3d & 1) == 0) && ((local_10a & 1) != 0)) &&
         (((ImVector<ImGuiPopupData> *)((long)local_30 + 0x4090))->Size <
          ((ImVector<ImGuiPopupData> *)((long)local_30 + 0x4080))->Size)) {
        OpenPopup((char *)in_stack_fffffffffffffe50,(ImGuiPopupFlags)in_stack_fffffffffffffe4c);
        local_1 = false;
      }
      else {
        local_3d = (local_3d & 1) != 0 || (local_10a & 1) != 0;
        if ((local_10a & 1) != 0) {
          OpenPopup((char *)in_stack_fffffffffffffe50,(ImGuiPopupFlags)in_stack_fffffffffffffe4c);
        }
        if ((local_3d & 1) == 0) {
          ImGuiNextWindowData::ClearFlags((ImGuiNextWindowData *)((long)local_30 + 0x3fb0));
        }
        else {
          ImVec2::ImVec2(&local_150,0.0,0.0);
          SetNextWindowPos(&local_60,1,&local_150);
          PushStyleVar((ImGuiStyleVar)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                       SUB84(in_stack_fffffffffffffe70,0));
          local_3d = BeginPopupEx(id_00,in_stack_fffffffffffffe7c);
          PopStyleVar(count);
        }
        local_1 = (bool)(local_3d & 1);
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginMenuEx(const char* label, const char* icon, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    bool menu_is_open = IsPopupOpen(id, ImGuiPopupFlags_None);

    // Sub-menus are ChildWindow so that mouse can be hovering across them (otherwise top-most popup menu would steal focus and not allow hovering on parent menu)
    // The first menu in a hierarchy isn't so hovering doesn't get accross (otherwise e.g. resizing borders with ImGuiButtonFlags_FlattenChildren would react), but top-most BeginMenu() will bypass that limitation.
    ImGuiWindowFlags flags = ImGuiWindowFlags_ChildMenu | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus;
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
        flags |= ImGuiWindowFlags_ChildWindow;

    // If a menu with same the ID was already submitted, we will append to it, matching the behavior of Begin().
    // We are relying on a O(N) search - so O(N log N) over the frame - which seems like the most efficient for the expected small amount of BeginMenu() calls per frame.
    // If somehow this is ever becoming a problem we can switch to use e.g. ImGuiStorage mapping key to last frame used.
    if (g.MenusIdSubmittedThisFrame.contains(id))
    {
        if (menu_is_open)
            menu_is_open = BeginPopupEx(id, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
        else
            g.NextWindowData.ClearFlags();          // we behave like Begin() and need to consume those values
        return menu_is_open;
    }

    // Tag menu as used. Next time BeginMenu() with same ID is called it will append to existing menu
    g.MenusIdSubmittedThisFrame.push_back(id);

    ImVec2 label_size = CalcTextSize(label, NULL, true);

    // Odd hack to allow hovering across menus of a same menu-set (otherwise we wouldn't be able to hover parent without always being a Child window)
    const bool menuset_is_open = IsRootOfOpenMenuSet();
    ImGuiWindow* backed_nav_window = g.NavWindow;
    if (menuset_is_open)
        g.NavWindow = window;

    // The reference position stored in popup_pos will be used by Begin() to find a suitable position for the child menu,
    // However the final position is going to be different! It is chosen by FindBestWindowPosForPopup().
    // e.g. Menus tend to overlap each other horizontally to amplify relative Z-ordering.
    ImVec2 popup_pos, pos = window->DC.CursorPos;
    PushID(label);
    if (!enabled)
        BeginDisabled();
    const ImGuiMenuColumns* offsets = &window->DC.MenuColumns;
    bool pressed;
    const ImGuiSelectableFlags selectable_flags = ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_SelectOnClick | ImGuiSelectableFlags_DontClosePopups;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Menu inside an horizontal menu bar
        // Selectable extend their highlight by half ItemSpacing in each direction.
        // For ChildMenu, the popup position will be overwritten by the call to FindBestWindowPosForPopup() in Begin()
        popup_pos = ImVec2(pos.x - 1.0f - IM_FLOOR(style.ItemSpacing.x * 0.5f), pos.y - style.FramePadding.y + window->MenuBarHeight());
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(style.ItemSpacing.x * 2.0f, style.ItemSpacing.y));
        float w = label_size.x;
        ImVec2 text_pos(window->DC.CursorPos.x + offsets->OffsetLabel, window->DC.CursorPos.y + window->DC.CurrLineTextBaseOffset);
        pressed = Selectable("", menu_is_open, selectable_flags, ImVec2(w, 0.0f));
        RenderText(text_pos, label);
        PopStyleVar();
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        // Menu inside a regular/vertical menu
        // (In a typical menu window where all items are BeginMenu() or MenuItem() calls, extra_w will always be 0.0f.
        //  Only when they are other items sticking out we're going to add spacing, yet only register minimum width into the layout system.
        popup_pos = ImVec2(pos.x, pos.y - style.WindowPadding.y);
        float icon_w = (icon && icon[0]) ? CalcTextSize(icon, NULL).x : 0.0f;
        float checkmark_w = IM_FLOOR(g.FontSize * 1.20f);
        float min_w = window->DC.MenuColumns.DeclColumns(icon_w, label_size.x, 0.0f, checkmark_w); // Feedback to next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - min_w);
        ImVec2 text_pos(window->DC.CursorPos.x + offsets->OffsetLabel, window->DC.CursorPos.y + window->DC.CurrLineTextBaseOffset);
        pressed = Selectable("", menu_is_open, selectable_flags | ImGuiSelectableFlags_SpanAvailWidth, ImVec2(min_w, 0.0f));
        RenderText(text_pos, label);
        if (icon_w > 0.0f)
            RenderText(pos + ImVec2(offsets->OffsetIcon, 0.0f), icon);
        RenderArrow(window->DrawList, pos + ImVec2(offsets->OffsetMark + extra_w + g.FontSize * 0.30f, 0.0f), GetColorU32(ImGuiCol_Text), ImGuiDir_Right);
    }
    if (!enabled)
        EndDisabled();

    const bool hovered = (g.HoveredId == id) && enabled && !g.NavDisableMouseHover;
    if (menuset_is_open)
        g.NavWindow = backed_nav_window;

    bool want_open = false;
    bool want_close = false;
    if (window->DC.LayoutType == ImGuiLayoutType_Vertical) // (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
    {
        // Close menu when not hovering it anymore unless we are moving roughly in the direction of the menu
        // Implement http://bjk5.com/post/44698559168/breaking-down-amazons-mega-dropdown to avoid using timers, so menus feels more reactive.
        bool moving_toward_other_child_menu = false;
        ImGuiWindow* child_menu_window = (g.BeginPopupStack.Size < g.OpenPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].SourceWindow == window) ? g.OpenPopupStack[g.BeginPopupStack.Size].Window : NULL;
        if (g.HoveredWindow == window && child_menu_window != NULL && !(window->Flags & ImGuiWindowFlags_MenuBar))
        {
            float ref_unit = g.FontSize; // FIXME-DPI
            ImRect next_window_rect = child_menu_window->Rect();
            ImVec2 ta = (g.IO.MousePos - g.IO.MouseDelta);
            ImVec2 tb = (window->Pos.x < child_menu_window->Pos.x) ? next_window_rect.GetTL() : next_window_rect.GetTR();
            ImVec2 tc = (window->Pos.x < child_menu_window->Pos.x) ? next_window_rect.GetBL() : next_window_rect.GetBR();
            float extra = ImClamp(ImFabs(ta.x - tb.x) * 0.30f, ref_unit * 0.5f, ref_unit * 2.5f);   // add a bit of extra slack.
            ta.x += (window->Pos.x < child_menu_window->Pos.x) ? -0.5f : +0.5f;                     // to avoid numerical issues (FIXME: ??)
            tb.y = ta.y + ImMax((tb.y - extra) - ta.y, -ref_unit * 8.0f);                           // triangle is maximum 200 high to limit the slope and the bias toward large sub-menus // FIXME: Multiply by fb_scale?
            tc.y = ta.y + ImMin((tc.y + extra) - ta.y, +ref_unit * 8.0f);
            moving_toward_other_child_menu = ImTriangleContainsPoint(ta, tb, tc, g.IO.MousePos);
            //GetForegroundDrawList()->AddTriangleFilled(ta, tb, tc, moving_toward_other_child_menu ? IM_COL32(0,128,0,128) : IM_COL32(128,0,0,128)); // [DEBUG]
        }
        if (menu_is_open && !hovered && g.HoveredWindow == window && g.HoveredIdPreviousFrame != 0 && g.HoveredIdPreviousFrame != id && !moving_toward_other_child_menu)
            want_close = true;

        // Open
        if (!menu_is_open && pressed) // Click/activate to open
            want_open = true;
        else if (!menu_is_open && hovered && !moving_toward_other_child_menu) // Hover to open
            want_open = true;
        if (g.NavId == id && g.NavMoveDir == ImGuiDir_Right) // Nav-Right to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }
    else
    {
        // Menu bar
        if (menu_is_open && pressed && menuset_is_open) // Click an open menu again to close it
        {
            want_close = true;
            want_open = menu_is_open = false;
        }
        else if (pressed || (hovered && menuset_is_open && !menu_is_open)) // First click to open, then hover to open others
        {
            want_open = true;
        }
        else if (g.NavId == id && g.NavMoveDir == ImGuiDir_Down) // Nav-Down to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }

    if (!enabled) // explicitly close if an open menu becomes disabled, facilitate users code a lot in pattern such as 'if (BeginMenu("options", has_object)) { ..use object.. }'
        want_close = true;
    if (want_close && IsPopupOpen(id, ImGuiPopupFlags_None))
        ClosePopupToLevel(g.BeginPopupStack.Size, true);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags | ImGuiItemStatusFlags_Openable | (menu_is_open ? ImGuiItemStatusFlags_Opened : 0));
    PopID();

    if (!menu_is_open && want_open && g.OpenPopupStack.Size > g.BeginPopupStack.Size)
    {
        // Don't recycle same menu level in the same frame, first close the other menu and yield for a frame.
        OpenPopup(label);
        return false;
    }

    menu_is_open |= want_open;
    if (want_open)
        OpenPopup(label);

    if (menu_is_open)
    {
        SetNextWindowPos(popup_pos, ImGuiCond_Always); // Note: this is super misleading! The value will serve as reference for FindBestWindowPosForPopup(), not actual pos.
        PushStyleVar(ImGuiStyleVar_ChildRounding, style.PopupRounding); // First level will use _PopupRounding, subsequent will use _ChildRounding
        menu_is_open = BeginPopupEx(id, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
        PopStyleVar();
    }
    else
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
    }

    return menu_is_open;
}